

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_index.h
# Opt level: O1

void __thiscall S2PointIndex<int>::Add(S2PointIndex<int> *this,PointData *point_data)

{
  S2CellId id;
  S2CellId local_48;
  key_type local_40;
  int local_38;
  VType local_30;
  VType VStack_28;
  VType local_20;
  
  S2CellId::S2CellId(&local_48,
                     &(point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl);
  local_38 = (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  local_40.id_ = local_48.id_;
  local_30 = (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
             super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0];
  VStack_28 = (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
              super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1];
  local_20 = (point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
             super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2];
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
  ::insert_multi<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>
            ((btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
              *)this,&local_40,(pair<const_S2CellId,_S2PointIndex<int>::PointData> *)&local_40);
  return;
}

Assistant:

void S2PointIndex<Data>::Add(const PointData& point_data) {
  S2CellId id(point_data.point());
  map_.insert(std::make_pair(id, point_data));
}